

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextBuffer::appendfv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int new_size;
  int iVar1;
  int iVar2;
  int iVar3;
  value_type_conflict1 *buf;
  va_list args_copy;
  __va_list_tag local_48;
  
  local_48.reg_save_area = args->reg_save_area;
  local_48.gp_offset = args->gp_offset;
  local_48.fp_offset = args->fp_offset;
  local_48.overflow_arg_area = args->overflow_arg_area;
  iVar3 = vsnprintf((char *)0x0,0,fmt,args);
  if (0 < iVar3) {
    iVar1 = (this->Buf).Size;
    iVar2 = (this->Buf).Capacity;
    new_size = iVar1 + iVar3;
    if (iVar2 <= new_size) {
      iVar2 = iVar2 * 2;
      if (iVar2 < new_size) {
        iVar2 = new_size;
      }
      ImVector<char>::reserve(&this->Buf,iVar2);
    }
    ImVector<char>::resize(&this->Buf,new_size);
    buf = ImVector<char>::operator[](&this->Buf,iVar1 + -1);
    ImFormatStringV(buf,(ulong)(iVar3 + 1),fmt,&local_48);
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendfv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = ImFormatStringV(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
    {
        va_end(args_copy);
        return;
    }

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off - 1], (size_t)len + 1, fmt, args_copy);
    va_end(args_copy);
}